

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

string * __thiscall kws::Parser::GetErrorTag_abi_cxx11_(Parser *this,unsigned_long number)

{
  long in_RDX;
  string *in_RDI;
  allocator local_19 [25];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,ErrorTag + in_RDX * 4,local_19);
  std::allocator<char>::~allocator((allocator<char> *)local_19);
  return in_RDI;
}

Assistant:

std::string Parser::GetErrorTag(unsigned long number) const
{
  return ErrorTag[number];
}